

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher-chachapoly.c
# Opt level: O0

int chachapoly_get_length(chachapoly_ctx *ctx,uint *plenp,uint seqnr,uchar *cp,uint len)

{
  uint32_t uVar1;
  uchar **local_48;
  uchar *ptr;
  u_char seqbuf [8];
  u_char buf [4];
  uint len_local;
  uchar *cp_local;
  uint seqnr_local;
  uint *plenp_local;
  chachapoly_ctx *ctx_local;
  
  if (len < 4) {
    ctx_local._4_4_ = -1;
  }
  else {
    local_48 = &ptr;
    seqbuf._4_4_ = len;
    _libssh2_store_u64((uchar **)&local_48,(ulong)seqnr);
    chacha_ivsetup(&ctx->header_ctx,(u8 *)&ptr,(u8 *)0x0);
    chacha_encrypt_bytes(&ctx->header_ctx,cp,seqbuf,4);
    uVar1 = _libssh2_ntohu32(seqbuf);
    *plenp = uVar1;
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int
chachapoly_get_length(struct chachapoly_ctx *ctx, unsigned int *plenp,
                      unsigned int seqnr, const unsigned char *cp,
                      unsigned int len)
{
    u_char buf[4], seqbuf[8];
    unsigned char *ptr = NULL;

    if(len < 4)
        return -1;
    ptr = &seqbuf[0];
    _libssh2_store_u64(&ptr, seqnr);
    chacha_ivsetup(&ctx->header_ctx, seqbuf, NULL);
    chacha_encrypt_bytes(&ctx->header_ctx, cp, buf, 4);
    *plenp = _libssh2_ntohu32(buf);
    return 0;
}